

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int Armor_off(void)

{
  obj *obj;
  int iVar1;
  char *pcVar2;
  
  if (uarm == (obj *)0x0) {
    return 0;
  }
  Oprops_off(uarm,1);
  obj = uarm;
  if ((((uarm == (obj *)0x0) || (0x15 < (ushort)(uarm->otyp - 0x54U))) ||
      (obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr == (char *)0x0)) ||
     (iVar1 = strncmp(obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr,"gold ",5),
     iVar1 != 0)) goto LAB_00183d5c;
  end_burn(obj,'\0');
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00183d16;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00183d11;
  }
  else {
LAB_00183d11:
    if (ublindf == (obj *)0x0) goto LAB_00183d5c;
LAB_00183d16:
    if (ublindf->oartifact != '\x1d') goto LAB_00183d5c;
  }
  pcVar2 = Tobjnam(uarm,"stop");
  pline("%s glowing.",pcVar2);
LAB_00183d5c:
  Armor_off_sub('\0');
  takeoff_mask = takeoff_mask & 0xfffffffe;
  setworn((obj *)0x0,1);
  encumber_msg();
  cancelled_don = '\0';
  return 0;
}

Assistant:

int Armor_off(void)
{
    if (!uarm) return 0;

    Oprops_off(uarm, W_ARM);

    if (uarm && Is_gold_dragon_armor(uarm->otyp)) {
	end_burn(uarm, FALSE);
	if (!Blind)
	    pline("%s glowing.", Tobjnam(uarm, "stop"));
    }
    Armor_off_sub(FALSE);
    takeoff_mask &= ~W_ARM;
    setworn(NULL, W_ARM);
    encumber_msg();
    cancelled_don = FALSE;
    return 0;
}